

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O0

void cfg_help_int(autobuf *out,int64_t min,int64_t max,uint16_t bytelen,uint16_t fraction)

{
  long lVar1;
  long local_a8;
  uint64_t scaling;
  uint64_t j;
  int64_t max64;
  int64_t min64;
  isonumber_str hbuf2;
  isonumber_str hbuf1;
  uint16_t fraction_local;
  uint16_t bytelen_local;
  int64_t max_local;
  int64_t min_local;
  autobuf *out_local;
  
  lVar1 = 0x7fffffffffffffff >> (('\b' - (char)bytelen) * '\b' & 0x3fU);
  local_a8 = 1;
  for (scaling = 0; scaling < fraction; scaling = scaling + 1) {
    local_a8 = local_a8 * 10;
  }
  isonumber_from_s64(hbuf2.buf + 0x28,min,"",local_a8,1);
  isonumber_from_s64((long)&min64 + 4,max,"",local_a8,1);
  if (-0x8000000000000000 >> (('\b' - (char)bytelen) * '\b' & 0x3fU) < min) {
    if (max < lVar1) {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte fractional integer between %s and %s with a maximum of %d fractional digits"
                 ,(ulong)bytelen,hbuf2.buf + 0x28,(long)&min64 + 4,(ulong)fraction);
    }
    else {
      cfg_append_printable_line
                (out,
                 "    Parameter must be a %d-byte fractional integer larger or equal than %s with a maximum of %d fractional digits"
                 ,(ulong)bytelen,hbuf2.buf + 0x28,(ulong)fraction);
    }
  }
  else if (max < lVar1) {
    cfg_append_printable_line
              (out,
               "    Parameter must be a %d-byte fractional integer smaller or equal than %s with a maximum of %d fractional digits"
               ,(ulong)bytelen,(long)&min64 + 4,(ulong)fraction);
  }
  else {
    cfg_append_printable_line
              (out,
               "    Parameter must be a %d-byte signed integer with a maximum of %d fractional digits"
               ,(ulong)bytelen,(ulong)fraction);
  }
  return;
}

Assistant:

void
cfg_help_int(struct autobuf *out, int64_t min, int64_t max, uint16_t bytelen, uint16_t fraction) {
  struct isonumber_str hbuf1, hbuf2;
  int64_t min64, max64;
  uint64_t j, scaling;

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  /* get string representation of min/max */
  isonumber_from_s64(&hbuf1, min, "", scaling, true);
  isonumber_from_s64(&hbuf2, max, "", scaling, true);

  if (min > min64) {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " between %s and %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " larger or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf1.buf, fraction );
    }
  }
  else {
    if (max < max64) {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte fractional integer"
                               " smaller or equal than %s with a maximum of %d fractional digits",
        bytelen, hbuf2.buf, fraction );
    }
    else {
      cfg_append_printable_line(out,
        CFG_HELP_INDENT_PREFIX "Parameter must be a %d-byte signed integer"
                               " with a maximum of %d fractional digits",
        bytelen, fraction );
    }
  }
}